

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Path.cpp
# Opt level: O2

void llvm::sys::path::native(Twine *path,SmallVectorImpl<char> *result,Style style)

{
  StringRef SVar1;
  
  if (((path->RHSKind == EmptyKind) && (path->LHSKind < 7)) &&
     ((0x7aU >> (path->LHSKind & 0x1f) & 1) != 0)) {
    SVar1 = Twine::getSingleStringRef(path);
    if (SVar1.Data ==
        (char *)(result->super_SmallVectorTemplateBase<char,_true>).
                super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.BeginX) {
      __assert_fail("(!path.isSingleStringRef() || path.getSingleStringRef().data() != result.data()) && \"path and result are not allowed to overlap!\""
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/third_party/llvm-project/Path.cpp"
                    ,0x1e0,
                    "void llvm::sys::path::native(const Twine &, SmallVectorImpl<char> &, Style)");
    }
  }
  (result->super_SmallVectorTemplateBase<char,_true>).super_SmallVectorTemplateCommon<char,_void>.
  super_SmallVectorBase.Size = 0;
  Twine::toVector(path,result);
  native(result,style);
  return;
}

Assistant:

void native(const Twine &path, SmallVectorImpl<char> &result, Style style) {
  assert((!path.isSingleStringRef() ||
          path.getSingleStringRef().data() != result.data()) &&
         "path and result are not allowed to overlap!");
  // Clear result.
  result.clear();
  path.toVector(result);
  native(result, style);
}